

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# union_array_union.hh
# Opt level: O3

void avro::codec_traits<uau::_union_array_union_Union__0__>::decode
               (Decoder *d,_union_array_union_Union__0__ *v)

{
  undefined4 uVar1;
  placeholder *tmp;
  ulong uVar2;
  placeholder *ppVar3;
  undefined8 *puVar4;
  placeholder *ppVar5;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  uVar2 = (**(code **)(*(long *)d + 0xb0))();
  if (1 < uVar2) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x18);
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Union index too big","");
    std::runtime_error::runtime_error((runtime_error *)(puVar4 + 1),(string *)local_40);
    *puVar4 = 0x1c87a8;
    puVar4[1] = 0x1c87d8;
    __cxa_throw(puVar4,&Exception::typeinfo,Exception::~Exception);
  }
  if ((uVar2 & 1) == 0) {
    (**(code **)(*(long *)d + 0x18))(d);
    ppVar5 = (v->value_).content;
    v->idx_ = 0;
    (v->value_).content = (placeholder *)0x0;
  }
  else {
    uVar1 = (**(code **)(*(long *)d + 0x28))();
    v->idx_ = 1;
    ppVar3 = (placeholder *)operator_new(0x10);
    ppVar3->_vptr_placeholder = (_func_int **)&PTR__placeholder_001c8ab0;
    *(undefined4 *)&ppVar3[1]._vptr_placeholder = uVar1;
    ppVar5 = (v->value_).content;
    (v->value_).content = ppVar3;
  }
  if (ppVar5 != (placeholder *)0x0) {
    (*ppVar5->_vptr_placeholder[1])();
    return;
  }
  return;
}

Assistant:

static void decode(Decoder& d, uau::_union_array_union_Union__0__& v) {
        size_t n = d.decodeUnionIndex();
        if (n >= 2) { throw avro::Exception("Union index too big"); }
        switch (n) {
        case 0:
            d.decodeNull();
            v.set_null();
            break;
        case 1:
            {
                int32_t vv;
                avro::decode(d, vv);
                v.set_int(vv);
            }
            break;
        }
    }